

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O2

Function * __thiscall
spvtools::opt::PrivateToLocalPass::FindLocalFunction(PrivateToLocalPass *this,Instruction *inst)

{
  uint32_t id;
  DefUseManager *this_00;
  bool found_first_use;
  Function *target_function;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  found_first_use = false;
  target_function = (Function *)0x0;
  this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  id = Instruction::result_id(inst);
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = ::operator_new(0x18);
  *(Function ***)local_50._M_unused._0_8_ = &target_function;
  *(bool **)((long)local_50._M_unused._0_8_ + 8) = &found_first_use;
  *(PrivateToLocalPass **)((long)local_50._M_unused._0_8_ + 0x10) = this;
  local_38 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/private_to_local_pass.cpp:93:7)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/private_to_local_pass.cpp:93:7)>
             ::_M_manager;
  analysis::DefUseManager::ForEachUser
            (this_00,id,(function<void_(spvtools::opt::Instruction_*)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return target_function;
}

Assistant:

Function* PrivateToLocalPass::FindLocalFunction(const Instruction& inst) const {
  bool found_first_use = false;
  Function* target_function = nullptr;
  context()->get_def_use_mgr()->ForEachUser(
      inst.result_id(),
      [&target_function, &found_first_use, this](Instruction* use) {
        BasicBlock* current_block = context()->get_instr_block(use);
        if (current_block == nullptr) {
          return;
        }

        if (!IsValidUse(use)) {
          found_first_use = true;
          target_function = nullptr;
          return;
        }
        Function* current_function = current_block->GetParent();
        if (!found_first_use) {
          found_first_use = true;
          target_function = current_function;
        } else if (target_function != current_function) {
          target_function = nullptr;
        }
      });
  return target_function;
}